

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioning.cpp
# Opt level: O2

void __thiscall
duckdb::RadixPartitionedTupleData::RepartitionFinalizeStates
          (RadixPartitionedTupleData *this,PartitionedTupleData *old_partitioned_data,
          PartitionedTupleData *new_partitioned_data,PartitionedTupleDataAppendState *state,
          idx_t finished_partition_idx)

{
  unsafe_vector<unique_ptr<TupleDataCollection>_> *puVar1;
  type this_00;
  byte bVar2;
  long lVar3;
  idx_t partition_index;
  ulong uVar4;
  long lVar5;
  
  bVar2 = (char)*(undefined4 *)&new_partitioned_data[1]._vptr_PartitionedTupleData -
          (char)*(undefined4 *)&old_partitioned_data[1]._vptr_PartitionedTupleData;
  uVar4 = finished_partition_idx << (bVar2 & 0x3f);
  puVar1 = PartitionedTupleData::GetPartitions(new_partitioned_data);
  lVar5 = uVar4 * 0x38;
  lVar3 = uVar4 * 8;
  for (; uVar4 < finished_partition_idx + 1 << (bVar2 & 0x3f); uVar4 = uVar4 + 1) {
    this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator*((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                           *)((long)&(((puVar1->
                                       super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                       ).
                                       super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                     )._M_t + lVar3));
    TupleDataCollection::FinalizePinState
              (this_00,(TupleDataPinState *)
                       ((long)&(((state->partition_pin_states).
                                 super_vector<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                                 .
                                 super__Vector_base<duckdb::TupleDataPinState,_std::allocator<duckdb::TupleDataPinState>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->row_handles).handles +
                       lVar5));
    lVar5 = lVar5 + 0x38;
    lVar3 = lVar3 + 8;
  }
  return;
}

Assistant:

void RadixPartitionedTupleData::RepartitionFinalizeStates(PartitionedTupleData &old_partitioned_data,
                                                          PartitionedTupleData &new_partitioned_data,
                                                          PartitionedTupleDataAppendState &state,
                                                          idx_t finished_partition_idx) const {
	D_ASSERT(old_partitioned_data.GetType() == PartitionedTupleDataType::RADIX &&
	         new_partitioned_data.GetType() == PartitionedTupleDataType::RADIX);
	const auto &old_radix_partitions = old_partitioned_data.Cast<RadixPartitionedTupleData>();
	const auto &new_radix_partitions = new_partitioned_data.Cast<RadixPartitionedTupleData>();
	const auto old_radix_bits = old_radix_partitions.GetRadixBits();
	const auto new_radix_bits = new_radix_partitions.GetRadixBits();
	D_ASSERT(new_radix_bits > old_radix_bits);

	// We take the most significant digits as the partition index
	// When repartitioning, e.g., partition 0 from "old" goes into the first N partitions in "new"
	// When partition 0 is done, we can already finalize the append states, unpinning blocks
	const auto multiplier = RadixPartitioning::NumberOfPartitions(new_radix_bits - old_radix_bits);
	const auto from_idx = finished_partition_idx * multiplier;
	const auto to_idx = from_idx + multiplier;
	auto &partitions = new_partitioned_data.GetPartitions();
	for (idx_t partition_index = from_idx; partition_index < to_idx; partition_index++) {
		auto &partition = *partitions[partition_index];
		auto &partition_pin_state = state.partition_pin_states[partition_index];
		partition.FinalizePinState(partition_pin_state);
	}
}